

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceProdLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reduceprod(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceProdLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reduceprod(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reduceprod(this);
    this_00 = (ReduceProdLayerParams *)operator_new(0x30);
    ReduceProdLayerParams::ReduceProdLayerParams(this_00);
    (this->layer_).reduceprod_ = this_00;
  }
  return (ReduceProdLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceProdLayerParams* NeuralNetworkLayer::mutable_reduceprod() {
  if (!has_reduceprod()) {
    clear_layer();
    set_has_reduceprod();
    layer_.reduceprod_ = new ::CoreML::Specification::ReduceProdLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceProd)
  return layer_.reduceprod_;
}